

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTableDrivenParser.cpp
# Opt level: O2

void parse(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  def;
  string buffer;
  SyntacticAnalyzer syntacticAnalyzer;
  istringstream in;
  
  std::__cxx11::string::string((string *)&syntacticAnalyzer,BNF,(allocator *)&buffer);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&in,(string *)&syntacticAnalyzer,_S_in);
  std::__cxx11::string::~string((string *)&syntacticAnalyzer);
  def.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  def.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  def.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&buffer);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&def,&buffer);
  }
  MyCompiler::SyntacticAnalyzer::SyntacticAnalyzer(&syntacticAnalyzer,&def);
  bVar1 = MyCompiler::SyntacticAnalyzer::tryParse(&syntacticAnalyzer,(istream *)&std::cin);
  pcVar4 = "invalid syntax";
  if (bVar1) {
    pcVar4 = "ok";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  MyCompiler::SyntacticAnalyzer::~SyntacticAnalyzer(&syntacticAnalyzer);
  std::__cxx11::string::~string((string *)&buffer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&def);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  return;
}

Assistant:

void parse()
{
    std::istringstream in(BNF);
    std::vector<std::string> def;
    std::string buffer;
    while (getline(in, buffer))
        def.push_back(buffer);
    MyCompiler::SyntacticAnalyzer syntacticAnalyzer(def);

    try
    {
        std::cout << (syntacticAnalyzer.tryParse(std::cin) ? "ok" : "invalid syntax") << std::endl;
    }
    catch (MyCompiler::LexicalError &err)
    {
        std::cout << "invalid token" << std::endl;
    }
}